

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::torrent::attach_peer(torrent *this,peer_connection *p)

{
  peer_class_t c;
  ip_filter *this_00;
  context *pcVar1;
  session_interface *psVar2;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  __last;
  long *plVar3;
  peer_list *this_01;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint uVar12;
  undefined4 extraout_var;
  __visit_result_t<libtorrent::aux::ssl_handle_visitor,_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
  s;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  peer_class *ppVar14;
  undefined4 extraout_var_04;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  _Var15;
  peer_connection *ppVar16;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int __type;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  endpoint *ep_02;
  ulong uVar17;
  int i;
  long lVar18;
  _List_node_base *p_Var19;
  string local_178;
  undefined4 local_14c;
  vector<peer_connection_*> *local_148;
  __weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *local_140;
  pointer local_138;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_130 [4];
  shared_ptr<libtorrent::aux::peer_connection> local_110;
  __shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> local_f0;
  torrent_state st;
  short *psVar13;
  
  if ((this->field_0x5e0 & 2) != 0) {
    s = ::std::
        visit<libtorrent::aux::ssl_handle_visitor,std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                  ((ssl_handle_visitor *)&st,
                   &(p->m_socket).
                    super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  );
    if (s == (__visit_result_t<libtorrent::aux::ssl_handle_visitor,_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
              )0x0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&st,requires_ssl_connection,(type *)0x0);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,1,0);
      return false;
    }
    pcVar1 = (this->m_ssl_ctx)._M_t.
             super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
             .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
    if (pcVar1 == (context *)0x0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&st,invalid_ssl_cert,(type *)0x0);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,0x11,0);
      return false;
    }
    bVar6 = aux::ssl::has_context(s,pcVar1->handle_);
    if (!bVar6) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&st,invalid_ssl_cert,(type *)0x0);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,1,0);
      return false;
    }
  }
  this->field_0x5c0 = this->field_0x5c0 | 4;
  if (((*(uint *)&this->field_0x5d8 >> 0x19 & 1) != 0) &&
     (this_00 = (this->m_ip_filter).
                super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this_00 != (ip_filter *)0x0)) {
    iVar7 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(p);
    psVar13 = (short *)CONCAT44(extraout_var,iVar7);
    if (*psVar13 != 2) {
      st._8_8_ = *(undefined8 *)(psVar13 + 4);
      st.ip.m_addresses[0][0]._0_8_ = *(undefined8 *)(psVar13 + 8);
      st.ip.m_addresses[0][0].ipv6_address_.addr_.__in6_u._0_8_ = ZEXT48(*(uint *)(psVar13 + 0xc));
      st.max_peerlist_size = 0;
    }
    else {
      st.max_peerlist_size = *(int *)(psVar13 + 2);
      st.min_reconnect_time = 0;
      st.loop_counter = 0;
      st.ip.m_addresses[0][0].type_ = ipv4;
      st.ip.m_addresses[0][0].ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      st.ip.m_addresses[0][0].ipv6_address_.addr_.__in6_u._0_8_ = 0;
    }
    st._0_4_ = ZEXT14(*psVar13 != 2);
    uVar8 = ip_filter::access(this_00,&st.is_finished,__type);
    if ((uVar8 & 1) != 0) {
      iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_00,iVar7) + 0x68) >> 8 & 1) != 0) {
        iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&st);
        iVar9 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(p);
        local_178._M_dataplus._M_p = (pointer)((ulong)local_178._M_dataplus._M_p._4_4_ << 0x20);
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::peer_blocked_alert::reason_t>
                  ((alert_manager *)CONCAT44(extraout_var_01,iVar7),(torrent_handle *)&st,
                   (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_02,iVar9),
                   (reason_t *)&local_178);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&st.min_reconnect_time);
      }
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&st,banned_by_ip_filter,(type *)0x0);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,1,0);
      return false;
    }
  }
  if ((3 < ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 6)
           - 2) &&
     (0 < (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length)) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&st,torrent_not_ready,(type *)0x0);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,1,0);
    return false;
  }
  psVar2 = (this->super_torrent_hot_members).m_ses;
  iVar7 = (*(psVar2->super_session_logger)._vptr_session_logger[9])(psVar2,p);
  if ((char)iVar7 == '\0') {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&st,peer_not_constructed,(type *)0x0);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,1,0);
    return false;
  }
  iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x11])();
  if ((char)iVar7 != '\0') {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&st,session_closing,(type *)0x0);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,1,0);
    return false;
  }
  uVar8 = 0;
  for (lVar18 = 0; lVar18 < (char)(p->super_peer_connection_hot_members).field_0x2c;
      lVar18 = lVar18 + 1) {
    c.m_val = *(uint *)(&p->field_0x38 + lVar18 * 4);
    iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x32])();
    ppVar14 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var_03,iVar7),c);
    if (ppVar14 != (peer_class *)0x0) {
      iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x32])();
      ppVar14 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var_04,iVar7),c);
      if ((int)uVar8 <= ppVar14->connection_limit_factor) {
        uVar8 = ppVar14->connection_limit_factor;
      }
    }
  }
  uVar17 = 100;
  if (uVar8 != 0) {
    uVar17 = (ulong)uVar8;
  }
  uVar8 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21);
  local_14c = 0;
  _Var15._M_current =
       (this->super_torrent_hot_members).m_connections.
       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       .
       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->super_torrent_hot_members).m_connections.
       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       .
       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)(((uVar8 & 0xffffff) * 100) / uVar17) <=
       (long)(int)((ulong)((long)__last._M_current - (long)_Var15._M_current) >> 3)) &&
     (local_14c = 1, (uVar8 & 0xfffffe) / 10 < (uint)this->m_num_connecting)) {
    _Var15 = ::std::
             __max_element<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(libtorrent::aux::peer_connection_const*,libtorrent::aux::peer_connection_const*)>>
                       (_Var15,__last,
                        (_Iter_comp_iter<bool_(*)(const_libtorrent::aux::peer_connection_*,_const_libtorrent::aux::peer_connection_*)>
                         )0x2e39bd);
    if ((_Var15._M_current ==
         (this->super_torrent_hot_members).m_connections.
         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
         .
         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (((((*_Var15._M_current)->super_peer_connection_hot_members).field_0x28 & 2) == 0 ||
        (iVar7 = (*((*_Var15._M_current)->super_bandwidth_socket)._vptr_bandwidth_socket[1])(),
        (char)iVar7 != '\0')))) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&st,too_many_connections,(type *)0x0);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&st,1,0);
      return false;
    }
    ppVar16 = *_Var15._M_current;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&st,too_many_connections,(type *)0x0);
    (*(ppVar16->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar16,&st,1,0);
    p->field_0x887 = p->field_0x887 & 0xef;
    local_14c = 0;
  }
  local_148 = &(this->super_torrent_hot_members).m_connections;
  local_140 = (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
              &p->super_enable_shared_from_this<libtorrent::aux::peer_connection>;
  p_Var19 = (_List_node_base *)&this->m_extensions;
  while (p_Var19 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                      *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var19 != (_List_node_base *)&this->m_extensions) {
    plVar3 = (long *)p_Var19[1]._M_next;
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &local_f0,local_140);
    ::std::__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::peer_connection,void>
              ((__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&local_138
               ,&local_f0);
    local_178._M_dataplus._M_p = local_138;
    local_178._M_string_length = (size_type)a_Stack_130[0]._M_pi;
    local_138 = (pointer)0x0;
    a_Stack_130[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (**(code **)(*plVar3 + 0x10))(&st,plVar3,&local_178);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(a_Stack_130);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    if (CONCAT44(st.max_peerlist_size,st._0_4_) != 0) {
      ::std::__shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,(__shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2> *)&st
                );
      peer_connection::add_extension(p,(shared_ptr<libtorrent::peer_plugin> *)&local_100);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st.min_reconnect_time);
  }
  get_peer_list_state(&st,this);
  need_peer_list(this);
  this_01 = (this->super_torrent_hot_members).m_peer_list._M_t.
            super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
            .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  uVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0xf])();
  bVar6 = peer_list::new_connection(this_01,&p->super_peer_connection_interface,uVar8 & 0xffff,&st);
  if (bVar6) {
    peers_erased(this,&st.erased);
    ::std::
    vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
    ::reserve(&this->m_peers_to_disconnect,
              ((long)(this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
    ::std::
    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ::reserve(&local_148->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ,((long)(this->super_torrent_hot_members).m_connections.
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      .
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_torrent_hot_members).m_connections.
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      .
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
    if ((char)local_14c == '\0') {
LAB_002e3619:
      if (((this->super_torrent_hot_members).field_0x4b & 0x20) != 0) {
        recalc_share_mode(this);
      }
      sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*>
                (&local_148->
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ,p);
      update_want_peers(this);
      update_want_tick(this);
      iVar7 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
      if ((CONCAT44(extraout_var_06,iVar7) != 0) &&
         (iVar7 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[7])(),
         (*(byte *)(CONCAT44(extraout_var_07,iVar7) + 0x1b) & 0x80) != 0)) {
        this->m_num_seeds = this->m_num_seeds + 1;
      }
      iVar7 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      bVar6 = true;
      if ((char)iVar7 != '\0') {
        iVar7 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
        print_endpoint_abi_cxx11_(&local_178,(aux *)CONCAT44(extraout_var_08,iVar7),ep_00);
        _Var5._M_p = local_178._M_dataplus._M_p;
        uVar8 = num_peers(this);
        uVar4 = *(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
        uVar12 = num_peers(this);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"ATTACHED CONNECTION \"%s\" connections: %d limit: %d num-peers: %d",
                   _Var5._M_p,(ulong)uVar8,(ulong)((uint)((ulong)uVar4 >> 0x21) & 0xffffff),
                   (ulong)uVar12);
        ::std::__cxx11::string::~string((string *)&local_178);
      }
      goto LAB_002e3851;
    }
    ppVar16 = find_lowest_ranking_peer(this);
    if (ppVar16 != (peer_connection *)0x0) {
      uVar10 = peer_connection::peer_rank(ppVar16);
      uVar11 = peer_connection::peer_rank(p);
      if (uVar10 < uVar11) {
        iVar7 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
        if ((char)iVar7 != '\0') {
          iVar7 = (*(ppVar16->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(ppVar16);
          print_endpoint_abi_cxx11_(&local_178,(aux *)CONCAT44(extraout_var_05,iVar7),ep);
          _Var5._M_p = local_178._M_dataplus._M_p;
          uVar8 = num_peers(this);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,
                     "CLOSING CONNECTION \"%s\" peer list full (low peer rank) connections: %d limit: %d"
                     ,_Var5._M_p,(ulong)uVar8,
                     (ulong)((uint)((ulong)*(undefined8 *)
                                            &(this->super_torrent_hot_members).field_0x48 >> 0x21) &
                            0xffffff));
          ::std::__cxx11::string::~string((string *)&local_178);
        }
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&local_178,too_many_connections,(type *)0x0);
        (*(ppVar16->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar16,&local_178,1,0);
        p->field_0x887 = p->field_0x887 & 0xef;
        goto LAB_002e3619;
      }
    }
    iVar7 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar7 != '\0') {
      iVar7 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
      print_endpoint_abi_cxx11_(&local_178,(aux *)CONCAT44(extraout_var_10,iVar7),ep_02);
      _Var5._M_p = local_178._M_dataplus._M_p;
      uVar8 = num_peers(this);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,
                 "CLOSING CONNECTION \"%s\" peer list full (low peer rank) connections: %d limit: %d"
                 ,_Var5._M_p,(ulong)uVar8,
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
      ::std::__cxx11::string::~string((string *)&local_178);
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&local_178,too_many_connections,(type *)0x0);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&local_178,1,0);
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &local_110,local_140);
    remove_peer(this,&local_110);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_110.
                super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    peers_erased(this,&st.erased);
    iVar7 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar7 != '\0') {
      iVar7 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
      print_endpoint_abi_cxx11_(&local_178,(aux *)CONCAT44(extraout_var_09,iVar7),ep_01);
      _Var5._M_p = local_178._M_dataplus._M_p;
      uVar8 = num_peers(this);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"CLOSING CONNECTION \"%s\" peer list full connections: %d limit: %d",
                 _Var5._M_p,(ulong)uVar8,
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
      ::std::__cxx11::string::~string((string *)&local_178);
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&local_178,too_many_connections,(type *)0x0);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,&local_178,1,0);
  }
  bVar6 = false;
LAB_002e3851:
  ::std::
  _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  ~_Vector_base(&st.erased.
                 super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               );
  return bVar6;
}

Assistant:

bool torrent::attach_peer(peer_connection* p) try
	{
//		INVARIANT_CHECK;

#ifdef TORRENT_SSL_PEERS
		if (is_ssl_torrent())
		{
			// if this is an SSL torrent, don't allow non SSL peers on it
			aux::socket_type& s = p->get_socket();

			ssl::stream_handle_type stream_handle = std::visit(ssl_handle_visitor{}, s.var());

			if (!stream_handle)
			{
				// don't allow non SSL peers on SSL torrents
				p->disconnect(errors::requires_ssl_connection, operation_t::bittorrent);
				return false;
			}

			if (!m_ssl_ctx)
			{
				// we don't have a valid cert, don't accept any connection!
				p->disconnect(errors::invalid_ssl_cert, operation_t::ssl_handshake);
				return false;
			}

			if (!ssl::has_context(stream_handle, ssl::get_handle(*m_ssl_ctx)))
			{
				// if the SSL context associated with this connection is
				// not the one belonging to this torrent, the SSL handshake
				// connected to one torrent, and the BitTorrent protocol
				// to a different one. This is probably an attempt to circumvent
				// access control. Don't allow it.
				p->disconnect(errors::invalid_ssl_cert, operation_t::bittorrent);
				return false;
			}
		}
#else // TORRENT_SSL_PEERS
		if (is_ssl_torrent())
		{
			// Don't accidentally allow seeding of SSL torrents, just
			// because libtorrent wasn't built with SSL support
			p->disconnect(errors::requires_ssl_connection, operation_t::ssl_handshake);
			return false;
		}
#endif // TORRENT_SSL_PEERS

		TORRENT_ASSERT(p != nullptr);
		TORRENT_ASSERT(!p->is_outgoing());

		m_has_incoming = true;

		if (m_apply_ip_filter
			&& m_ip_filter
			&& m_ip_filter->access(p->remote().address()) & ip_filter::blocked)
		{
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, p->remote(), peer_blocked_alert::ip_filter);
			p->disconnect(errors::banned_by_ip_filter, operation_t::bittorrent);
			return false;
		}

		if (!is_downloading_state(m_state) && valid_metadata())
		{
			p->disconnect(errors::torrent_not_ready, operation_t::bittorrent);
			return false;
		}

		if (!m_ses.has_connection(p))
		{
			p->disconnect(errors::peer_not_constructed, operation_t::bittorrent);
			return false;
		}

		if (m_ses.is_aborted())
		{
			p->disconnect(errors::session_closing, operation_t::bittorrent);
			return false;
		}

		int connection_limit_factor = 0;
		for (int i = 0; i < p->num_classes(); ++i)
		{
			peer_class_t pc = p->class_at(i);
			if (m_ses.peer_classes().at(pc) == nullptr) continue;
			int f = m_ses.peer_classes().at(pc)->connection_limit_factor;
			if (connection_limit_factor < f) connection_limit_factor = f;
		}
		if (connection_limit_factor == 0) connection_limit_factor = 100;

		std::int64_t const limit = std::int64_t(m_max_connections) * 100 / connection_limit_factor;

		bool maybe_replace_peer = false;

		if (m_connections.end_index() >= limit)
		{
			// if more than 10% of the connections are outgoing
			// connection attempts that haven't completed yet,
			// disconnect one of them and let this incoming
			// connection through.
			if (m_num_connecting > m_max_connections / 10)
			{
				// find one of the connecting peers and disconnect it
				// find any peer that's connecting (i.e. a half-open TCP connection)
				// that's also not disconnecting
				// disconnect the peer that's been waiting to establish a connection
				// the longest
				auto i = std::max_element(begin(), end(), &connecting_time_compare);

				if (i == end() || !(*i)->is_connecting() || (*i)->is_disconnecting())
				{
					// this seems odd, but we might as well handle it
					p->disconnect(errors::too_many_connections, operation_t::bittorrent);
					return false;
				}
				(*i)->disconnect(errors::too_many_connections, operation_t::bittorrent);

				// if this peer was let in via connections slack,
				// it has done its duty of causing the disconnection
				// of another peer
				p->peer_disconnected_other();
			}
			else
			{
				maybe_replace_peer = true;
			}
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			std::shared_ptr<peer_plugin> pp(ext->new_connection(
					peer_connection_handle(p->self())));
			if (pp) p->add_extension(pp);
		}
#endif
		torrent_state st = get_peer_list_state();
		need_peer_list();
		if (!m_peer_list->new_connection(*p, m_ses.session_time(), &st))
		{
			peers_erased(st.erased);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("CLOSING CONNECTION \"%s\" peer list full "
					"connections: %d limit: %d"
					, print_endpoint(p->remote()).c_str()
					, num_peers()
					, m_max_connections);
			}
#endif
			p->disconnect(errors::too_many_connections, operation_t::bittorrent);
			return false;
		}
		peers_erased(st.erased);

		m_peers_to_disconnect.reserve(m_connections.size() + 1);
		m_connections.reserve(m_connections.size() + 1);

#if TORRENT_USE_ASSERTS
		error_code ec;
		TORRENT_ASSERT(p->remote() == p->get_socket().remote_endpoint(ec) || ec);
#endif

		TORRENT_ASSERT(p->peer_info_struct() != nullptr);

		// we need to do this after we've added the peer to the peer_list
		// since that's when the peer is assigned its peer_info object,
		// which holds the rank
		if (maybe_replace_peer)
		{
			// now, find the lowest rank peer and disconnect that
			// if it's lower rank than the incoming connection
			peer_connection* peer = find_lowest_ranking_peer();

			// TODO: 2 if peer is a really good peer, maybe we shouldn't disconnect it
			// perhaps this logic should be disabled if we have too many idle peers
			// (with some definition of idle)
			if (peer != nullptr && peer->peer_rank() < p->peer_rank())
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("CLOSING CONNECTION \"%s\" peer list full (low peer rank) "
						"connections: %d limit: %d"
						, print_endpoint(peer->remote()).c_str()
						, num_peers()
						, m_max_connections);
				}
#endif
				peer->disconnect(errors::too_many_connections, operation_t::bittorrent);
				p->peer_disconnected_other();
			}
			else
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("CLOSING CONNECTION \"%s\" peer list full (low peer rank) "
						"connections: %d limit: %d"
						, print_endpoint(p->remote()).c_str()
						, num_peers()
						, m_max_connections);
				}
#endif
				p->disconnect(errors::too_many_connections, operation_t::bittorrent);
				// we have to do this here because from the peer's point of view
				// it wasn't really attached to the torrent, but we do need
				// to let peer_list know we're removing it
				remove_peer(p->self());
				return false;
			}
		}

#if TORRENT_USE_INVARIANT_CHECKS
		if (m_peer_list) m_peer_list->check_invariant();
#endif

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode)
			recalc_share_mode();
#endif

		// once we add the peer to our m_connections list, we can't throw an
		// exception. That will end up violating an invariant between the session,
		// torrent and peers
		TORRENT_ASSERT(sorted_find(m_connections, p) == m_connections.end());
		TORRENT_ASSERT(m_iterating_connections == 0);
		sorted_insert(m_connections, p);
		update_want_peers();
		update_want_tick();

		if (p->peer_info_struct() && p->peer_info_struct()->seed)
		{
			TORRENT_ASSERT(m_num_seeds < 0xffff);
			++m_num_seeds;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log()) try
		{
			debug_log("ATTACHED CONNECTION \"%s\" connections: %d limit: %d num-peers: %d"
				, print_endpoint(p->remote()).c_str(), num_peers()
				, m_max_connections
				, num_peers());
		}
		catch (std::exception const&) {}
#endif

		return true;
	}
	catch (...)
	{
		p->disconnect(errors::torrent_not_ready, operation_t::bittorrent);
		// from the peer's point of view it was never really added to the torrent.
		// So we need to clean it up here before propagating the error
		remove_peer(p->self());
		return false;
	}